

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,char>
::write_number<int,false>
          (binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char>
           *this,int n)

{
  pointer pvVar1;
  element_type *peVar2;
  undefined4 in_ESI;
  byte *in_RDI;
  array<char,_4UL> vec;
  undefined4 in_stack_fffffffffffffff0;
  
  memset(&stack0xfffffffffffffff0,0,4);
  pvVar1 = std::array<char,_4UL>::data((array<char,_4UL> *)0xdfe702);
  *(undefined4 *)pvVar1 = in_ESI;
  if ((*in_RDI & 1) != 0) {
    std::array<char,_4UL>::begin((array<char,_4UL> *)0xdfe726);
    std::array<char,_4UL>::end((array<char,_4UL> *)0xdfe735);
    std::reverse<char*>((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(char *)in_RDI);
  }
  peVar2 = std::
           __shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xdfe750);
  pvVar1 = std::array<char,_4UL>::data((array<char,_4UL> *)0xdfe75e);
  (*peVar2->_vptr_output_adapter_protocol[1])(peVar2,pvVar1,4);
  return;
}

Assistant:

void write_number(const NumberType n)
    {
        // step 1: write number to array of length NumberType
        std::array<CharType, sizeof(NumberType)> vec{};
        std::memcpy(vec.data(), &n, sizeof(NumberType));

        // step 2: write array to output (with possible reordering)
        if (is_little_endian != OutputIsLittleEndian)
        {
            // reverse byte order prior to conversion if necessary
            std::reverse(vec.begin(), vec.end());
        }

        oa->write_characters(vec.data(), sizeof(NumberType));
    }